

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O0

void __thiscall
vkt::texture::anon_unknown_3::TextureFilteringTestInstance::TextureFilteringTestInstance
          (TextureFilteringTestInstance *this,Context *ctx,TestCaseData *testCaseData,
          ShaderSpec *shaderSpec,
          MovePtr<vkt::texture::(anonymous_namespace)::DataGenerator,_de::DefaultDeleter<vkt::texture::(anonymous_namespace)::DataGenerator>_>
          *gen)

{
  size_type sVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  DataGenerator *pDVar8;
  byte local_3e;
  DefaultDeleter<vkt::texture::(anonymous_namespace)::DataGenerator> local_3d [7];
  deUint8 compNdx;
  MovePtr<vkt::texture::(anonymous_namespace)::DataGenerator,_de::DefaultDeleter<vkt::texture::(anonymous_namespace)::DataGenerator>_>
  *local_30;
  MovePtr<vkt::texture::(anonymous_namespace)::DataGenerator,_de::DefaultDeleter<vkt::texture::(anonymous_namespace)::DataGenerator>_>
  *gen_local;
  ShaderSpec *shaderSpec_local;
  TestCaseData *testCaseData_local;
  Context *ctx_local;
  TextureFilteringTestInstance *this_local;
  
  local_30 = gen;
  gen_local = (MovePtr<vkt::texture::(anonymous_namespace)::DataGenerator,_de::DefaultDeleter<vkt::texture::(anonymous_namespace)::DataGenerator>_>
               *)shaderSpec;
  shaderSpec_local = (ShaderSpec *)testCaseData;
  testCaseData_local = (TestCaseData *)ctx;
  ctx_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,ctx);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__TextureFilteringTestInstance_01670958;
  this->m_shaderType = *(ShaderType *)((long)&(shaderSpec_local->source).field_2 + 0xc);
  shaderexecutor::ShaderSpec::ShaderSpec(&this->m_shaderSpec,(ShaderSpec *)gen_local);
  ImageViewParameters::ImageViewParameters
            (&this->m_imParams,(ImageViewParameters *)&shaderSpec_local->outputs);
  uVar6 = *(undefined4 *)&(shaderSpec_local->globalDeclarations)._M_string_length;
  uVar7 = *(undefined4 *)((long)&(shaderSpec_local->globalDeclarations)._M_string_length + 4);
  sVar1 = (shaderSpec_local->globalDeclarations).field_2._M_allocated_capacity;
  uVar2 = *(undefined8 *)((long)&(shaderSpec_local->globalDeclarations).field_2 + 8);
  uVar3 = *(undefined8 *)&shaderSpec_local->source;
  uVar4 = *(undefined8 *)&(shaderSpec_local->source).field_0x4;
  uVar5 = *(undefined8 *)((long)&(shaderSpec_local->source)._M_string_length + 4);
  (this->m_samplerParams).lodBias = (float)(int)uVar4;
  (this->m_samplerParams).minLod = (float)(int)((ulong)uVar4 >> 0x20);
  (this->m_samplerParams).maxLod = (float)(int)uVar5;
  (this->m_samplerParams).isUnnormalized = (bool)(char)((ulong)uVar5 >> 0x20);
  (this->m_samplerParams).isCompare = (bool)(char)((ulong)uVar5 >> 0x28);
  *(short *)&(this->m_samplerParams).field_0x2a = (short)((ulong)uVar5 >> 0x30);
  (this->m_samplerParams).wrappingModeV = (int)uVar2;
  (this->m_samplerParams).wrappingModeW = (int)((ulong)uVar2 >> 0x20);
  (this->m_samplerParams).borderColor = (int)uVar3;
  (this->m_samplerParams).lodBias = (float)(int)((ulong)uVar3 >> 0x20);
  (this->m_samplerParams).magFilter = uVar6;
  (this->m_samplerParams).minFilter = uVar7;
  (this->m_samplerParams).mipmapFilter = (int)sVar1;
  (this->m_samplerParams).wrappingModeU = (int)(sVar1 >> 0x20);
  this->m_sampleLookupSettings =
       *(SampleLookupSettings *)((long)&(shaderSpec_local->source).field_2 + 4);
  std::vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>::vector
            (&this->m_sampleArguments);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_imAllocation);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move(&this->m_im);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_imView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::Move(&this->m_sampler);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::Move(&this->m_extraResourcesLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::Move(&this->m_extraResourcesPool);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move(&this->m_extraResourcesSet);
  de::details::
  MovePtr<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  ::MovePtr(&this->m_executor);
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            (&this->m_levels,
             (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             shaderSpec_local);
  pDVar8 = de::details::
           MovePtr<vkt::texture::(anonymous_namespace)::DataGenerator,_de::DefaultDeleter<vkt::texture::(anonymous_namespace)::DataGenerator>_>
           ::release(gen);
  de::DefaultDeleter<vkt::texture::(anonymous_namespace)::DataGenerator>::DefaultDeleter(local_3d);
  de::details::
  MovePtr<vkt::texture::(anonymous_namespace)::DataGenerator,_de::DefaultDeleter<vkt::texture::(anonymous_namespace)::DataGenerator>_>
  ::MovePtr(&this->m_gen,pDVar8);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_resultSamples);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_resultCoords);
  for (local_3e = 0; local_3e < 3; local_3e = local_3e + 1) {
  }
  return;
}

Assistant:

TextureFilteringTestInstance::TextureFilteringTestInstance (Context&					ctx,
															const TestCaseData&			testCaseData,
															const ShaderSpec&			shaderSpec,
															de::MovePtr<DataGenerator>	gen)
	: TestInstance				(ctx)
	, m_shaderType				(testCaseData.shaderType)
	, m_shaderSpec				(shaderSpec)
	, m_imParams				(testCaseData.imParams)
	, m_samplerParams			(testCaseData.samplerParams)
	, m_sampleLookupSettings	(testCaseData.sampleLookupSettings)
	, m_levels					(testCaseData.pba)
	, m_gen						(gen.release())
{
	for (deUint8 compNdx = 0; compNdx < 3; ++compNdx)
		DE_ASSERT(m_imParams.size[compNdx] > 0);
}